

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,InvarianceTestInstance *this)

{
  pointer pTVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pLVar4;
  int count;
  pointer pTVar5;
  Location LVar6;
  Location *pLVar7;
  ProgramCollection<vk::ProgramBinary> *pPVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  pointer __last;
  Allocation *pAVar16;
  bool bVar17;
  deUint32 queueFamilyIndex;
  int iVar18;
  deUint32 stride;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  ulong uVar19;
  ostream *poVar20;
  pointer pWVar21;
  GraphicsPipelineBuilder *pGVar22;
  ProgramBinary *pPVar23;
  pointer __result;
  allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *paVar24;
  TessPrimitiveType primitiveType;
  long lVar25;
  allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *paVar26;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *unsorted;
  size_t __n;
  TessPrimitiveType primitiveType_00;
  long lVar27;
  long lVar28;
  PerPrimitive *pPVar29;
  ulong bufferSize;
  char *pcVar30;
  tessellation *__a;
  __normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
  __last_00;
  int stride_00;
  int levelNdx;
  int iVar31;
  long lVar32;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *p_Var33;
  pointer pPVar34;
  allocator<char> local_66c;
  allocator<char> local_66b;
  allocator<char> local_66a;
  allocator<char> local_669;
  PerPrimitiveVec firstPrim;
  PerPrimitiveVec prim0;
  int local_608;
  RefBase<vk::VkCommandBuffer_s_*> local_5f8;
  long local_5d0;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_5c8;
  string local_5a0;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  tessLevelCases;
  PerPrimitiveVec primitives;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  primitiveCounts;
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> windingCases;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_4f8;
  int primitiveCount;
  deUint32 dStack_4d4;
  Location LStack_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  Location local_4b8;
  Location LStack_4b0;
  deUint32 local_3dc;
  bool local_3d8;
  VkPrimitiveTopology local_3d4;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_358;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_338;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_318;
  VkDescriptorBufferInfo resultBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_2d8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_2b8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_298;
  Buffer resultBuffer;
  Buffer vertexBuffer;
  string local_218;
  string local_1f8;
  string local_1d8;
  ostringstream tessLevelsStr;
  deUint32 dStack_1b4;
  DeviceInterface *pDStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,0xb);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(&tessLevelCases,this);
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar31 = 0;
  for (lVar28 = 0;
      lVar28 < (int)((ulong)((long)tessLevelCases.
                                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)tessLevelCases.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
      lVar28 = lVar28 + 1) {
    _primitiveCount = (Location)0x0;
    LStack_4d0.m_binding = 0;
    LStack_4d0.m_arrayElement = 0;
    local_4c8._M_allocated_capacity = 0;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&primitiveCounts,(vector<int,_std::allocator<int>_> *)&primitiveCount);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&primitiveCount);
    lVar27 = 8;
    for (lVar32 = 0;
        pTVar5 = tessLevelCases.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar28].levels.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar32 < (int)(((long)tessLevelCases.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar28].levels.
                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) / 0x18);
        lVar32 = lVar32 + 1) {
      iVar18 = referencePrimitiveCount
                         ((this->m_caseDef).primitiveType,(this->m_caseDef).spacingMode,
                          (this->m_caseDef).usePointMode,
                          (float *)((long)pTVar5->inner + lVar27 + -8),
                          (float *)((long)pTVar5->inner + lVar27));
      primitiveCount = iVar18;
      std::vector<int,_std::allocator<int>_>::push_back
                (primitiveCounts.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 (value_type_conflict4 *)&primitiveCount);
      if (iVar31 <= primitiveCount) {
        iVar31 = primitiveCount;
      }
      lVar27 = lVar27 + 0x18;
    }
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(format);
  makeBufferCreateInfo((VkBufferCreateInfo *)&primitiveCount,(ulong)(stride * 0xc),0x80);
  tessellation::Buffer::Buffer
            (&vertexBuffer,vk,device,allocator,(VkBufferCreateInfo *)&primitiveCount,
             (MemoryRequirement)0x1);
  iVar18 = numVerticesPerPrimitive((this->m_caseDef).primitiveType,(this->m_caseDef).usePointMode);
  bufferSize = (long)(iVar31 * iVar18 * 2) << 6 | 0x10;
  makeBufferCreateInfo((VkBufferCreateInfo *)&primitiveCount,bufferSize,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&primitiveCount,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&primitiveCount);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&primitiveCount,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,8);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&tessLevelsStr,this_00,vk,device,0);
  local_318.m_data.deleter.m_device = (VkDevice)local_1a8[0]._0_8_;
  local_318.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_318.m_data.object.m_internal._0_4_ = _tessLevelsStr;
  local_318.m_data.object.m_internal._4_4_ = dStack_1b4;
  local_318.m_data.deleter.m_deviceIface = pDStack_1b0;
  _tessLevelsStr = 0;
  dStack_1b4 = 0;
  pDStack_1b0 = (DeviceInterface *)0x0;
  local_1a8[0]._M_allocated_capacity = (VkDevice)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&tessLevelsStr);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&primitiveCount);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&tessLevelsStr);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&tessLevelsStr,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&primitiveCount,this_01,vk,device,1,1);
  local_298.m_data.deleter.m_device = (VkDevice)local_4c8._M_allocated_capacity;
  local_298.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4c8._8_8_;
  local_298.m_data.object.m_internal = (deUint64)_primitiveCount;
  local_298.m_data.deleter.m_deviceIface = (DeviceInterface *)LStack_4d0;
  _primitiveCount = (Location)0x0;
  LStack_4d0.m_binding = 0;
  LStack_4d0.m_arrayElement = 0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&primitiveCount);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&tessLevelsStr);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&primitiveCount,vk,device,
                    (VkDescriptorPool)local_298.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_318.m_data.object.m_internal);
  local_338.m_data.deleter.m_device = (VkDevice)local_4c8._M_allocated_capacity;
  local_338.m_data.deleter.m_pool.m_internal = local_4c8._8_8_;
  local_338.m_data.object.m_internal = (deUint64)_primitiveCount;
  local_338.m_data.deleter.m_deviceIface = (DeviceInterface *)LStack_4d0;
  _primitiveCount = (Location)0x0;
  LStack_4d0.m_binding = 0;
  LStack_4d0.m_arrayElement = 0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&primitiveCount);
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&primitiveCount);
  _tessLevelsStr = 0;
  dStack_1b4 = 0;
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&primitiveCount,
                       (VkDescriptorSet)local_338.m_data.object.m_internal,
                       (Location *)&tessLevelsStr,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &resultBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&primitiveCount);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&primitiveCount,vk,device);
  local_4f8.m_data.deleter.m_device = (VkDevice)local_4c8._M_allocated_capacity;
  local_4f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4c8._8_8_;
  local_4f8.m_data.object.m_internal = (deUint64)_primitiveCount;
  local_4f8.m_data.deleter.m_deviceIface = (DeviceInterface *)LStack_4d0;
  _primitiveCount = (Location)0x0;
  LStack_4d0.m_binding = 0;
  LStack_4d0.m_arrayElement = 0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&primitiveCount);
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&primitiveCount,vk,device,
             (VkRenderPass)local_4f8.m_data.object.m_internal);
  local_2b8.m_data.deleter.m_device = (VkDevice)local_4c8._M_allocated_capacity;
  local_2b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4c8._8_8_;
  local_2b8.m_data.object.m_internal = (deUint64)_primitiveCount;
  local_2b8.m_data.deleter.m_deviceIface = (DeviceInterface *)LStack_4d0;
  _primitiveCount = (Location)0x0;
  LStack_4d0.m_binding = 0;
  LStack_4d0.m_arrayElement = 0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&primitiveCount);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&primitiveCount,vk,device,
                     (VkDescriptorSetLayout)local_318.m_data.object.m_internal);
  local_358.m_data.deleter.m_device = (VkDevice)local_4c8._M_allocated_capacity;
  local_358.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4c8._8_8_;
  local_358.m_data.object.m_internal = (deUint64)_primitiveCount;
  local_358.m_data.deleter.m_deviceIface = (DeviceInterface *)LStack_4d0;
  _primitiveCount = (Location)0x0;
  LStack_4d0.m_binding = 0;
  LStack_4d0.m_arrayElement = 0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&primitiveCount);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&primitiveCount,vk,device,
                  queueFamilyIndex);
  local_2d8.m_data.deleter.m_device = (VkDevice)local_4c8._M_allocated_capacity;
  local_2d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_4c8._8_8_;
  local_2d8.m_data.object.m_internal = (deUint64)_primitiveCount;
  local_2d8.m_data.deleter.m_deviceIface = (DeviceInterface *)LStack_4d0;
  _primitiveCount = (Location)0x0;
  LStack_4d0.m_binding = 0;
  LStack_4d0.m_arrayElement = 0;
  local_4c8._M_allocated_capacity = 0;
  local_4c8._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&primitiveCount);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&primitiveCount,vk,device,
             (VkCommandPool)local_2d8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_5f8.m_data.deleter.m_device = (VkDevice)local_4c8._M_allocated_capacity;
  local_5f8.m_data.deleter.m_pool.m_internal = local_4c8._8_8_;
  local_5f8.m_data.object = (VkCommandBuffer_s *)_primitiveCount;
  local_5f8.m_data.deleter.m_deviceIface = (DeviceInterface *)LStack_4d0;
  primitiveCount = 0;
  dStack_4d4 = 0;
  LStack_4d0.m_binding = 0;
  LStack_4d0.m_arrayElement = 0;
  local_4c8._M_allocated_capacity._0_4_ = 0;
  local_4c8._M_allocated_capacity._4_4_ = 0;
  local_4c8._8_4_ = 0;
  local_4c8._12_4_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&primitiveCount);
  lVar28 = 0;
  do {
    pLVar4 = tessLevelCases.
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)tessLevelCases.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tessLevelCases.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar28) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&primitiveCount,"OK",(allocator<char> *)&tessLevelsStr);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&primitiveCount);
      std::__cxx11::string::~string((string *)&primitiveCount);
LAB_0070a958:
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_5f8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_2d8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_358);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_2b8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_4f8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_338);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_298);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_318);
      tessellation::Buffer::~Buffer(&resultBuffer);
      tessellation::Buffer::~Buffer(&vertexBuffer);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&primitiveCounts);
      std::
      vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
      ::~vector(&tessLevelCases);
      return __return_storage_ptr__;
    }
    firstPrim.
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    firstPrim.
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    firstPrim.
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    LVar6 = (Location)((this->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessLevelsStr);
    primitiveType_00 = (int)lVar28 * 0x20;
    pLVar4 = pLVar4 + lVar28;
    lVar27 = 0;
    lVar32 = 0;
    local_5d0 = lVar28;
    while( true ) {
      uVar19 = ((long)(pLVar4->levels).
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pLVar4->levels).
                     super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      lVar25 = (long)(int)uVar19;
      if (lVar25 <= lVar32) break;
      pcVar30 = "\n";
      if (uVar19 < 2) {
        pcVar30 = "";
      }
      poVar20 = std::operator<<((ostream *)&tessLevelsStr,pcVar30);
      getTessellationLevelsString_abi_cxx11_
                ((string *)&primitiveCount,
                 (tessellation *)
                 ((long)((pLVar4->levels).
                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         ._M_impl.super__Vector_impl_data._M_start)->inner + lVar27),
                 (TessLevels *)(ulong)(this->m_caseDef).primitiveType,(TessPrimitiveType)lVar25);
      std::operator<<(poVar20,(string *)&primitiveCount);
      std::__cxx11::string::~string((string *)&primitiveCount);
      lVar32 = lVar32 + 1;
      lVar27 = lVar27 + 0x18;
    }
    _primitiveCount = LVar6;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&LStack_4d0);
    std::operator<<((ostream *)&LStack_4d0,"Tessellation level sets: ");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&LStack_4d0,(string *)&local_5c8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&primitiveCount,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&LStack_4d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessLevelsStr);
    for (lVar27 = 0;
        pTVar5 = (pLVar4->levels).
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar27 < (int)(((long)(pLVar4->levels).
                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) / 0x18);
        lVar27 = lVar27 + 1) {
      local_4c8._M_allocated_capacity = (size_type)*(Location *)(pTVar5[lVar27].outer + 2);
      pTVar1 = pTVar5 + lVar27;
      primitiveCount = (int)pTVar1->inner[0];
      dStack_4d4 = (deUint32)pTVar1->inner[1];
      LStack_4d0.m_binding = (deUint32)pTVar1->outer[0];
      LStack_4d0.m_arrayElement = (deUint32)pTVar1->outer[1];
      LStack_4b0 = *(Location *)(pTVar5[lVar27].outer + 2);
      pTVar1 = pTVar5 + lVar27;
      local_4c8._8_4_ = pTVar1->inner[0];
      local_4c8._12_4_ = pTVar1->inner[1];
      local_4b8.m_binding = (deUint32)pTVar1->outer[0];
      local_4b8.m_arrayElement = (deUint32)pTVar1->outer[1];
      pLVar7 = (Location *)
               (vertexBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr;
      pLVar7[4] = local_4b8;
      pLVar7[5] = LStack_4b0;
      pLVar7[2] = (Location)local_4c8._M_allocated_capacity;
      pLVar7[3] = (Location)local_4c8._8_8_;
      *pLVar7 = _primitiveCount;
      pLVar7[1] = LStack_4d0;
      ::vk::flushMappedMemoryRange
                (vk,device,
                 (VkDeviceMemory)
                 ((vertexBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (vertexBuffer.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,0x30);
      getWindingCases(&windingCases,(this->m_caseDef).windingUsage);
      iVar31 = 0;
      for (pWVar21 = windingCases.
                     super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pWVar21 !=
          windingCases.
          super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
          ._M_impl.super__Vector_impl_data._M_finish; pWVar21 = pWVar21 + 1) {
        memset((GraphicsPipelineBuilder *)&primitiveCount,0,0xfc);
        local_3d8 = false;
        local_3d4 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
        local_3dc = 6;
        pGVar22 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                            ((GraphicsPipelineBuilder *)&primitiveCount,VK_FORMAT_R32_SFLOAT,stride)
        ;
        pPVar8 = ((this->super_TestInstance).m_context)->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"vert",&local_669);
        pPVar23 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar8,&local_5a0);
        pGVar22 = GraphicsPipelineBuilder::setShader
                            (pGVar22,vk,device,VK_SHADER_STAGE_VERTEX_BIT,pPVar23,
                             (VkSpecializationInfo *)0x0);
        pPVar8 = ((this->super_TestInstance).m_context)->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>((string *)&primitives,"tesc",&local_66a);
        pPVar23 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar8,(string *)&primitives);
        pGVar22 = GraphicsPipelineBuilder::setShader
                            (pGVar22,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar23,
                             (VkSpecializationInfo *)0x0);
        pPVar8 = ((this->super_TestInstance).m_context)->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"tese",&local_66b);
        getProgramName((string *)&prim0,&local_1d8,*pWVar21,(this->m_caseDef).usePointMode);
        pPVar23 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar8,(string *)&prim0);
        pGVar22 = GraphicsPipelineBuilder::setShader
                            (pGVar22,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar23,
                             (VkSpecializationInfo *)0x0);
        pPVar8 = ((this->super_TestInstance).m_context)->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"geom",&local_66c);
        getProgramName(&local_1f8,&local_218,(this->m_caseDef).usePointMode);
        pPVar23 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar8,&local_1f8);
        pGVar22 = GraphicsPipelineBuilder::setShader
                            (pGVar22,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar23,
                             (VkSpecializationInfo *)0x0);
        GraphicsPipelineBuilder::build
                  ((Move<vk::Handle<(vk::HandleType)18>_> *)&tessLevelsStr,pGVar22,vk,device,
                   (VkPipelineLayout)local_358.m_data.object.m_internal,
                   (VkRenderPass)local_4f8.m_data.object.m_internal);
        local_5c8.m_data.deleter.m_device = (VkDevice)local_1a8[0]._0_8_;
        local_5c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
        local_5c8.m_data.object.m_internal._0_4_ = _tessLevelsStr;
        local_5c8.m_data.object.m_internal._4_4_ = dStack_1b4;
        local_5c8.m_data.deleter.m_deviceIface = pDStack_1b0;
        _tessLevelsStr = 0;
        dStack_1b4 = 0;
        pDStack_1b0 = (DeviceInterface *)0x0;
        local_1a8[0]._M_allocated_capacity = (VkDevice)0x0;
        local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&tessLevelsStr);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&prim0);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&primitives);
        std::__cxx11::string::~string((string *)&local_5a0);
        GraphicsPipelineBuilder::~GraphicsPipelineBuilder
                  ((GraphicsPipelineBuilder *)&primitiveCount);
        pAVar16 = resultBuffer.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        memset((resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,0,bufferSize);
        ::vk::flushMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar16->m_memory).m_internal,pAVar16->m_offset,
                   bufferSize);
        beginCommandBuffer(vk,local_5f8.m_data.object);
        beginRenderPassWithRasterizationDisabled
                  (vk,local_5f8.m_data.object,(VkRenderPass)local_4f8.m_data.object.m_internal,
                   (VkFramebuffer)local_2b8.m_data.object.m_internal);
        (*vk->_vptr_DeviceInterface[0x4c])
                  (vk,local_5f8.m_data.object,0,local_5c8.m_data.object.m_internal);
        (*vk->_vptr_DeviceInterface[0x56])
                  (vk,local_5f8.m_data.object,0,local_358.m_data.object.m_internal,0,1,&local_338,0,
                   0);
        primitiveCount = 0;
        dStack_4d4 = 0;
        (*vk->_vptr_DeviceInterface[0x58])
                  (vk,local_5f8.m_data.object,0,1,&vertexBuffer,
                   (VkBufferMemoryBarrier *)&primitiveCount);
        (*vk->_vptr_DeviceInterface[0x59])(vk,local_5f8.m_data.object,0xc,1,0,0);
        endRenderPass(vk,local_5f8.m_data.object);
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&primitiveCount,0x40,0x2000,
                   (VkBuffer)
                   resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                   .m_internal,0,bufferSize);
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,local_5f8.m_data.object,0x8000,0x4000,0,0,0,1,
                   (VkBufferMemoryBarrier *)&primitiveCount,0,0);
        endCommandBuffer(vk,local_5f8.m_data.object);
        submitCommandsAndWait(vk,device,queue,local_5f8.m_data.object);
        pAVar16 = resultBuffer.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        uVar19 = bufferSize;
        ::vk::invalidateMappedMemoryRange
                  (vk,device,
                   (VkDeviceMemory)
                   ((resultBuffer.m_allocation.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_memory).m_internal,
                   (resultBuffer.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset,bufferSize);
        stride_00 = (int)uVar19;
        iVar18 = primitiveCounts.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_5d0].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar27];
        numVerticesPerPrimitive((this->m_caseDef).primitiveType,(this->m_caseDef).usePointMode);
        count = *pAVar16->m_hostPtr;
        paVar26 = (allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *)0x10;
        readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
                  ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    *)&primitiveCount,count,pAVar16->m_hostPtr,0x10,stride_00);
        __a = (tessellation *)&primitiveCount;
        sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
                  (&primitives,(tessellation *)&primitiveCount,unsorted,
                   (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)paVar26);
        iVar18 = iVar18 * 2;
        std::
        _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ::~_Vector_base((_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         *)&primitiveCount);
        pPVar34 = primitives.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        LVar6 = (Location)((this->super_TestInstance).m_context)->m_testCtx->m_log;
        if (count != iVar18) {
          _primitiveCount = LVar6;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&LStack_4d0);
          std::operator<<((ostream *)&LStack_4d0,"Failure: got ");
          std::ostream::operator<<(&LStack_4d0,count);
          std::operator<<((ostream *)&LStack_4d0," primitives, but expected ");
          std::ostream::operator<<(&LStack_4d0,iVar18);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&primitiveCount,(EndMessageToken *)&tcu::TestLog::EndMessage)
          ;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&LStack_4d0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&primitiveCount,"Invalid set of primitives",
                     (allocator<char> *)&tessLevelsStr);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&primitiveCount);
          std::__cxx11::string::~string((string *)&primitiveCount);
LAB_0070a927:
          std::
          _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::~_Vector_base(&primitives.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         );
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_5c8);
          std::_Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
          ::~_Vector_base(&windingCases.
                           super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                         );
          std::
          _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::~_Vector_base(&firstPrim.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         );
          goto LAB_0070a958;
        }
        iVar18 = (int)((ulong)((long)primitives.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)primitives.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6) >> 1);
        p_Var33 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   *)(long)iVar18;
        prim0.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        prim0.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        prim0.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ::_S_check_init_len((size_type)p_Var33,(allocator_type *)__a);
        prim0.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ._M_impl.super__Vector_impl_data._M_start =
             std::
             _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             ::_M_allocate(p_Var33,(size_t)__a);
        __last_00._M_current = pPVar34 + (long)p_Var33;
        prim0.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             prim0.
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)p_Var33;
        prim0.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             std::
             __uninitialized_copy_a<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::PerPrimitive_const*,std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>>>,vkt::tessellation::(anonymous_namespace)::PerPrimitive*,vkt::tessellation::(anonymous_namespace)::PerPrimitive>
                       ((__normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
                         )pPVar34,__last_00,
                        prim0.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start,paVar26);
        primitiveType = (TessPrimitiveType)paVar26;
        bVar17 = comparePrimitivesExact
                           (prim0.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start,__last_00._M_current,iVar18);
        __last = prim0.
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pPVar34 = prim0.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (!bVar17) {
          _tessLevelsStr = LVar6;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_1b0);
          std::operator<<((ostream *)&pDStack_1b0,
                          "Failure: tessellation coordinates differ between two primitives drawn in one draw call"
                         );
          _primitiveCount =
               (Location)
               tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&tessLevelsStr,
                          (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&LStack_4d0);
          std::operator<<((ostream *)&LStack_4d0,
                          "Note: tessellation levels for both primitives were: ");
          getTessellationLevelsString_abi_cxx11_
                    (&local_5a0,(tessellation *)(pTVar5 + lVar27),
                     (TessLevels *)(ulong)(this->m_caseDef).primitiveType,primitiveType);
          std::operator<<((ostream *)&LStack_4d0,(string *)&local_5a0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&primitiveCount,(EndMessageToken *)&tcu::TestLog::EndMessage)
          ;
          std::__cxx11::string::~string((string *)&local_5a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&LStack_4d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_1b0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&primitiveCount,"Invalid set of primitives",
                     (allocator<char> *)&tessLevelsStr);
          tcu::TestStatus::fail(__return_storage_ptr__,(string *)&primitiveCount);
LAB_0070a910:
          std::__cxx11::string::~string((string *)&primitiveCount);
          std::
          _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::~_Vector_base(&prim0.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         );
          goto LAB_0070a927;
        }
        local_608 = (int)lVar27;
        if (iVar31 == 0 && local_608 == 0) {
          paVar26 = (allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *)
                    ((long)prim0.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)prim0.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          p_Var33 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     *)((long)paVar26 >> 6);
          if ((allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *)
              ((long)firstPrim.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)firstPrim.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start) < paVar26) {
            paVar24 = paVar26;
            __result = std::
                       _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       ::_M_allocate(p_Var33,(size_t)__last_00._M_current);
            std::
            __uninitialized_copy_a<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::PerPrimitive_const*,std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>>>,vkt::tessellation::(anonymous_namespace)::PerPrimitive*,vkt::tessellation::(anonymous_namespace)::PerPrimitive>
                      ((__normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
                        )pPVar34,
                       (__normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
                        )__last,__result,paVar24);
            std::
            _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            ::_M_deallocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             *)firstPrim.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                            (pointer)((long)firstPrim.
                                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)firstPrim.
                                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 6),__n);
            firstPrim.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)__result + (long)paVar26);
            firstPrim.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            ._M_impl.super__Vector_impl_data._M_start = __result;
          }
          else {
            paVar24 = (allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *)
                      ((long)firstPrim.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)firstPrim.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start);
            if (paVar24 < paVar26) {
              lVar25 = 0;
              for (lVar32 = (long)paVar24 >> 6; 0 < lVar32; lVar32 = lVar32 + -1) {
                puVar2 = (undefined8 *)
                         ((long)(prim0.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                         lVar25 + -8);
                puVar3 = (undefined8 *)
                         ((long)(firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                         lVar25 + -8);
                uVar9 = *puVar2;
                uVar10 = puVar2[1];
                uVar11 = puVar2[2];
                uVar12 = puVar2[3];
                uVar13 = puVar2[4];
                uVar14 = puVar2[5];
                uVar15 = puVar2[7];
                puVar3[6] = puVar2[6];
                puVar3[7] = uVar15;
                puVar3[4] = uVar13;
                puVar3[5] = uVar14;
                puVar3[2] = uVar11;
                puVar3[3] = uVar12;
                *puVar3 = uVar9;
                puVar3[1] = uVar10;
                lVar25 = lVar25 + 0x40;
              }
              pPVar34 = firstPrim.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pPVar29 = (PerPrimitive *)
                             ((long)prim0.
                                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)paVar24);
                  pPVar29 != __last; pPVar29 = pPVar29 + 1) {
                PerPrimitive::PerPrimitive(pPVar34,pPVar29);
                pPVar34 = pPVar34 + 1;
              }
            }
            else {
              lVar32 = 0;
              for (; 0 < (long)p_Var33;
                  p_Var33 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             *)((long)&p_Var33[-1]._M_impl.super__Vector_impl_data._M_end_of_storage
                               + 7)) {
                puVar2 = (undefined8 *)
                         ((long)(prim0.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                         lVar32 + -8);
                puVar3 = (undefined8 *)
                         ((long)(firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                         lVar32 + -8);
                uVar9 = *puVar2;
                uVar10 = puVar2[1];
                uVar11 = puVar2[2];
                uVar12 = puVar2[3];
                uVar13 = puVar2[4];
                uVar14 = puVar2[5];
                uVar15 = puVar2[7];
                puVar3[6] = puVar2[6];
                puVar3[7] = uVar15;
                puVar3[4] = uVar13;
                puVar3[5] = uVar14;
                puVar3[2] = uVar11;
                puVar3[3] = uVar12;
                *puVar3 = uVar9;
                puVar3[1] = uVar10;
                lVar32 = lVar32 + 0x40;
              }
            }
          }
          firstPrim.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)firstPrim.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                               ._M_impl.super__Vector_impl_data._M_start + (long)paVar26);
        }
        else {
          iVar18 = (*(this->super_TestInstance)._vptr_TestInstance[4])
                             (this,&firstPrim,&prim0,(ulong)(uint)pLVar4->mem);
          if ((char)iVar18 == '\0') {
            _primitiveCount = LVar6;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&LStack_4d0);
            std::operator<<((ostream *)&LStack_4d0,
                            "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
                           );
            std::operator<<((ostream *)&LStack_4d0,"  - case A: program 0, tessellation levels: ");
            getTessellationLevelsString_abi_cxx11_
                      ((string *)&tessLevelsStr,
                       (tessellation *)
                       tessLevelCases.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar28].levels.
                       super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (TessLevels *)(ulong)(this->m_caseDef).primitiveType,primitiveType_00);
            std::operator<<((ostream *)&LStack_4d0,(string *)&tessLevelsStr);
            std::operator<<((ostream *)&LStack_4d0,"\n");
            std::operator<<((ostream *)&LStack_4d0,"  - case B: program ");
            std::ostream::operator<<(&LStack_4d0,iVar31);
            std::operator<<((ostream *)&LStack_4d0,", tessellation levels: ");
            getTessellationLevelsString_abi_cxx11_
                      (&local_5a0,(tessellation *)(pTVar5 + lVar27),
                       (TessLevels *)(ulong)(this->m_caseDef).primitiveType,primitiveType_00);
            std::operator<<((ostream *)&LStack_4d0,(string *)&local_5a0);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&primitiveCount,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_5a0);
            std::__cxx11::string::~string((string *)&tessLevelsStr);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&LStack_4d0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&primitiveCount,"Invalid set of primitives",
                       (allocator<char> *)&tessLevelsStr);
            tcu::TestStatus::fail(__return_storage_ptr__,(string *)&primitiveCount);
            goto LAB_0070a910;
          }
        }
        std::
        _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ::~_Vector_base(&prim0.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       );
        std::
        _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ::~_Vector_base(&primitives.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       );
        iVar31 = iVar31 + 1;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_5c8);
      }
      std::_Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::
      ~_Vector_base(&windingCases.
                     super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                   );
    }
    std::
    _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    ::~_Vector_base(&firstPrim.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   );
    lVar28 = local_5d0 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus InvarianceTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(),
					FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const std::vector<LevelCase>	tessLevelCases				= genTessLevelCases();
	const int						numPatchesPerDrawCall		= 2;
	int								maxNumPrimitivesPerPatch	= 0;  // computed below
	std::vector<std::vector<int> >	primitiveCounts;

	for (int caseNdx = 0; caseNdx < static_cast<int>(tessLevelCases.size()); ++caseNdx)
	{
		primitiveCounts.push_back(std::vector<int>());
		for (int levelNdx = 0; levelNdx < static_cast<int>(tessLevelCases[caseNdx].levels.size()); ++levelNdx)
		{
			const int primitiveCount = referencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, m_caseDef.usePointMode,
															   &tessLevelCases[caseNdx].levels[levelNdx].inner[0], &tessLevelCases[caseNdx].levels[levelNdx].outer[0]);
			primitiveCounts.back().push_back(primitiveCount);
			maxNumPrimitivesPerPatch = de::max(maxNumPrimitivesPerPatch, primitiveCount);
		}
	}

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = NUM_TESS_LEVELS * numPatchesPerDrawCall * vertexStride;
	const Buffer       vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of primitives and an array of PerPrimitive structures

	const int		   resultBufferMaxVertices		= numPatchesPerDrawCall * maxNumPrimitivesPerPatch * numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + resultBufferMaxVertices * sizeof(PerPrimitive);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < static_cast<int>(tessLevelCases.size()); ++tessLevelCaseNdx)
	{
		const LevelCase& levelCase = tessLevelCases[tessLevelCaseNdx];
		PerPrimitiveVec  firstPrim;

		{
			tcu::TestLog& log = m_context.getTestContext().getLog();
			std::ostringstream tessLevelsStr;

			for (int i = 0; i < static_cast<int>(levelCase.levels.size()); ++i)
				tessLevelsStr << (levelCase.levels.size() > 1u ? "\n" : "") << getTessellationLevelsString(levelCase.levels[i], m_caseDef.primitiveType);

			log << tcu::TestLog::Message << "Tessellation level sets: " << tessLevelsStr.str() << tcu::TestLog::EndMessage;
		}

		for (int subTessLevelCaseNdx = 0; subTessLevelCaseNdx < static_cast<int>(levelCase.levels.size()); ++subTessLevelCaseNdx)
		{
			const TessLevels& tessLevels = levelCase.levels[subTessLevelCaseNdx];
			{
				TessLevels data[2];
				data[0] = tessLevels;
				data[1] = tessLevels;

				const Allocation& alloc = vertexBuffer.getAllocation();
				deMemcpy(alloc.getHostPtr(), data, sizeof(data));
				flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(data));
			}

			int programNdx = 0;
			const std::vector<Winding> windingCases = getWindingCases(m_caseDef.windingUsage);
			for (std::vector<Winding>::const_iterator windingIter = windingCases.begin(); windingIter != windingCases.end(); ++windingIter)
			{
				const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
					.setPatchControlPoints        (NUM_TESS_LEVELS)
					.setVertexInputSingleAttribute(vertexFormat, vertexStride)
					.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", *windingIter, m_caseDef.usePointMode)), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", m_caseDef.usePointMode)), DE_NULL)
					.build                        (vk, device, *pipelineLayout, *renderPass));

				{
					const Allocation& alloc = resultBuffer.getAllocation();
					deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
					flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
				}

				beginCommandBuffer(vk, *cmdBuffer);
				beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

				vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
				vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
				{
					const VkDeviceSize vertexBufferOffset = 0ull;
					vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				}

				vk.cmdDraw(*cmdBuffer, numPatchesPerDrawCall * NUM_TESS_LEVELS, 1u, 0u, 0u);
				endRenderPass(vk, *cmdBuffer);

				{
					const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
						VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

					vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
						0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
				}

				endCommandBuffer(vk, *cmdBuffer);
				submitCommandsAndWait(vk, device, queue, *cmdBuffer);

				// Verify case result
				{
					const Allocation& resultAlloc = resultBuffer.getAllocation();
					invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

					const int				refNumPrimitives     = numPatchesPerDrawCall * primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx];
					const int				numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
					const deInt32			numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
					const PerPrimitiveVec	primitives           = sorted(readInterleavedData<PerPrimitive>(numPrimitives, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(PerPrimitive)),
																		  byPatchPrimitiveID);

					// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
					DE_ASSERT(numPrimitiveVertices * numPrimitives <= resultBufferMaxVertices);
					DE_UNREF(numPrimitiveVertices);

					tcu::TestLog& log = m_context.getTestContext().getLog();

					if (numPrimitives != refNumPrimitives)
					{
						log << tcu::TestLog::Message << "Failure: got " << numPrimitives << " primitives, but expected " << refNumPrimitives << tcu::TestLog::EndMessage;

						return tcu::TestStatus::fail("Invalid set of primitives");
					}

					const int					half  = static_cast<int>(primitives.size() / 2);
					const PerPrimitiveVec		prim0 = PerPrimitiveVec(primitives.begin(), primitives.begin() + half);
					const PerPrimitive* const	prim1 = &primitives[half];

					if (!comparePrimitivesExact(&prim0[0], prim1, half))
					{
							log << tcu::TestLog::Message << "Failure: tessellation coordinates differ between two primitives drawn in one draw call" << tcu::TestLog::EndMessage
								<< tcu::TestLog::Message << "Note: tessellation levels for both primitives were: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType) << tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
					}

					if (programNdx == 0 && subTessLevelCaseNdx == 0)
						firstPrim = prim0;
					else
					{
						const bool compareOk = compare(firstPrim, prim0, levelCase.mem);
						if (!compareOk)
						{
							log << tcu::TestLog::Message
								<< "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
								<< "  - case A: program 0, tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx].levels[0], m_caseDef.primitiveType) << "\n"
								<< "  - case B: program " << programNdx << ", tessellation levels: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType)
								<< tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
						}
					}
				}
				++programNdx;
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}